

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O3

CURLcode rtsp_setup_connection(Curl_easy *data,connectdata *conn)

{
  byte *pbVar1;
  CURLcode CVar2;
  FILEPROTO *pFVar3;
  
  if ((*(byte *)((long)&conn->proto + 0x34) & 2) == 0) {
    Curl_dyn_init((dynbuf *)&(conn->proto).ftpc,1000000);
    pbVar1 = (byte *)((long)&conn->proto + 0x34);
    *pbVar1 = *pbVar1 | 2;
  }
  pFVar3 = (FILEPROTO *)(*Curl_ccalloc)(1,0x10);
  (data->req).p.file = pFVar3;
  CVar2 = CURLE_OUT_OF_MEMORY;
  if (pFVar3 != (FILEPROTO *)0x0) {
    CVar2 = CURLE_OK;
  }
  return CVar2;
}

Assistant:

static CURLcode rtsp_setup_connection(struct Curl_easy *data,
                                      struct connectdata *conn)
{
  struct rtsp_conn *rtspc = &conn->proto.rtspc;
  struct RTSP *rtsp;
  (void)conn;

  if(!rtspc->initialised) {
    Curl_dyn_init(&rtspc->buf, MAX_RTP_BUFFERSIZE);
    rtspc->initialised = TRUE;
  }

  data->req.p.rtsp = rtsp = calloc(1, sizeof(struct RTSP));
  if(!rtsp)
    return CURLE_OUT_OF_MEMORY;

  return CURLE_OK;
}